

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

bool __thiscall
duckdb::BitstringAggBindData::Equals(BitstringAggBindData *this,FunctionData *other_p)

{
  bool bVar1;
  BitstringAggBindData *pBVar2;
  ulong uVar3;
  long in_RDI;
  BitstringAggBindData *other;
  FunctionData *in_stack_ffffffffffffffe0;
  bool local_1;
  
  pBVar2 = FunctionData::Cast<duckdb::BitstringAggBindData>(in_stack_ffffffffffffffe0);
  bVar1 = Value::IsNull((Value *)(in_RDI + 8));
  if ((((bVar1) && (bVar1 = Value::IsNull(&pBVar2->min), bVar1)) &&
      (bVar1 = Value::IsNull((Value *)(in_RDI + 0x48)), bVar1)) &&
     (bVar1 = Value::IsNull(&pBVar2->max), bVar1)) {
    local_1 = true;
  }
  else {
    uVar3 = duckdb::Value::NotDistinctFrom((Value *)(in_RDI + 8),&pBVar2->min);
    if (((uVar3 & 1) == 0) ||
       (uVar3 = duckdb::Value::NotDistinctFrom((Value *)(in_RDI + 0x48),&pBVar2->max),
       (uVar3 & 1) == 0)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Equals(const FunctionData &other_p) const override {
		auto &other = other_p.Cast<BitstringAggBindData>();
		if (min.IsNull() && other.min.IsNull() && max.IsNull() && other.max.IsNull()) {
			return true;
		}
		if (Value::NotDistinctFrom(min, other.min) && Value::NotDistinctFrom(max, other.max)) {
			return true;
		}
		return false;
	}